

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<11,_0,_5,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  int col_1;
  int col;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  Mat2 m;
  float afStack_74 [5];
  int local_60 [6];
  Matrix<float,_2,_2> local_48;
  Matrix<float,_2,_2> local_38;
  undefined4 local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  pfVar1 = (float *)&local_38;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  puVar3 = &s_constInMat2;
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      pfVar1[lVar4 * 2] = (float)puVar3[lVar4 * 2];
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pfVar1 = pfVar1 + 1;
    puVar3 = puVar3 + 1;
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  pfVar1 = (float *)&local_48;
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar6 = 0;
      }
      pfVar1[lVar4 * 2] = (float)uVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pfVar1 = pfVar1 + 1;
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  local_48.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  local_48.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  tcu::operator+((tcu *)&local_20,&local_38,&local_48);
  afStack_74[2] = (float)local_20;
  afStack_74[3] = (float)local_18;
  afStack_74[4] = local_1c + local_14;
  local_60[2] = 0;
  local_60[3] = 1;
  local_60[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_60[lVar2]] = afStack_74[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) + getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}